

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_type this;
  undefined8 uVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  ostream *poVar8;
  logic_error *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  _Alloc_hider _Var9;
  Date DVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  string command;
  shared_ptr<Node> condition;
  string line;
  Database db;
  istringstream is;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  Date local_288;
  undefined4 uStack_27c;
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_268;
  undefined7 uStack_267;
  _Any_data local_258;
  code *local_248;
  code *pcStack_240;
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  Database local_210;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  TestAll();
  local_210.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.storage._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_210.storage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.presence._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_210.presence._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_278 = &local_268;
  local_270 = 0;
  local_268 = 0;
  local_210.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.storage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_210.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.presence._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    cVar5 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'x');
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&local_278,cVar5);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      if (local_278 != &local_268) {
        operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
      }
      std::
      _Rb_tree<Date,_std::pair<const_Date,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_Date,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_210.presence._M_t);
      std::
      _Rb_tree<Date,_std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<Date,_std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<Date>,_std::allocator<std::pair<const_Date,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&local_210);
      return 0;
    }
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_278,_S_in);
    local_2a8._M_string_length = 0;
    local_2a8.field_2._M_local_buf[0] = '\0';
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::operator>>((istream *)local_1b0,(string *)&local_2a8);
    iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
    if (iVar6 == 0) {
      DVar10 = ParseDate((istream *)local_1b0);
      local_288._0_8_ = DVar10._0_8_;
      local_288.day = DVar10.day;
      ParseEvent_abi_cxx11_(&local_2c8,(istream *)local_1b0);
      Database::Add(&local_210,&local_288,&local_2c8);
LAB_001098f5:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
      if (iVar6 == 0) {
        Database::Print(&local_210,(ostream *)&std::cout);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
        if (iVar6 == 0) {
          ParseCondition((istream *)&local_2c8);
          this = local_2c8._M_string_length;
          _Var9._M_p = local_2c8._M_dataplus._M_p;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_2c8._M_string_length + 8) =
                   *(_Atomic_word *)(local_2c8._M_string_length + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_2c8._M_string_length + 8) =
                   *(_Atomic_word *)(local_2c8._M_string_length + 8) + 1;
            }
          }
          local_228 = (code *)0x0;
          pcStack_220 = (code *)0x0;
          local_238._M_unused._M_object = (void *)0x0;
          local_238._8_8_ = 0;
          local_238._M_unused._M_object = operator_new(0x10);
          *(pointer *)local_238._M_unused._0_8_ = _Var9._M_p;
          *(size_type *)((long)local_238._M_unused._0_8_ + 8) = this;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(this + 8) = *(_Atomic_word *)(this + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(this + 8) = *(_Atomic_word *)(this + 8) + 1;
            }
          }
          pcStack_220 = std::
                        _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:42:30)>
                        ::_M_invoke;
          local_228 = std::
                      _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:42:30)>
                      ::_M_manager;
          iVar6 = Database::RemoveIf(&local_210,(Predicate *)&local_238);
          if (local_228 != (code *)0x0) {
            (*local_228)(&local_238,&local_238,__destroy_functor);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Removed ",8);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," entries",8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
            p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length;
          }
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)&local_2a8);
            if (iVar6 == 0) {
              DVar10 = ParseDate((istream *)local_1b0);
              local_288._0_8_ = DVar10._0_8_;
              local_288.day = DVar10.day;
              Database::Last_abi_cxx11_(&local_2c8,&local_210,&local_288);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,local_2c8._M_dataplus._M_p,
                                  local_2c8._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              goto LAB_001098f5;
            }
            if (local_2a8._M_string_length != 0) {
              this_00 = (logic_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_2c8,"Unknown command: ",&local_2a8);
              std::logic_error::logic_error(this_00,(string *)&local_2c8);
              __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            goto LAB_00109b3b;
          }
          ParseCondition((istream *)&local_288);
          uVar4 = local_288._0_8_;
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(uStack_27c,local_288.day);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          local_258._M_unused._M_object = (void *)0x0;
          local_258._8_8_ = 0;
          local_248 = (code *)0x0;
          pcStack_240 = (code *)0x0;
          local_258._M_unused._M_object = operator_new(0x10);
          *(undefined8 *)local_258._M_unused._0_8_ = uVar4;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_258._M_unused._0_8_ + 8) =
               p_Var2;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          pcStack_240 = std::
                        _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:52:30)>
                        ::_M_invoke;
          local_248 = std::
                      _Function_handler<bool_(const_Date_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rsaddatimov[P]database-cpp-project/main.cpp:52:30)>
                      ::_M_manager;
          Database::FindIf((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_2c8,&local_210,(Predicate *)&local_258);
          _Var9._M_p = local_2c8._M_dataplus._M_p;
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length;
          if (local_248 != (code *)0x0) {
            (*local_248)(&local_258,&local_258,__destroy_functor);
            _Var9._M_p = local_2c8._M_dataplus._M_p;
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8._M_string_length;
          }
          for (; (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_p != p_Var3;
              _Var9._M_p = (pointer)((long)_Var9._M_p + 0x20)) {
            lVar1._0_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_p)->_M_use_count
            ;
            lVar1._4_4_ = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_p)->
                          _M_weak_count;
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,
                                (char *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var9._M_p)
                                        ->_vptr__Sp_counted_base,lVar1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Found ",6);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," entries",8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2c8);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(uStack_27c,local_288.day);
        }
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
    }
LAB_00109b3b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,
                      CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                               local_2a8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
  } while( true );
}

Assistant:

int main() {
    TestAll();

    Database db;

    for (string line; getline(cin, line); ) {
        istringstream is(line);

        string command;
        is >> command;

        if (command == "Add") {
            const auto date = ParseDate(is);
            const auto event = ParseEvent(is);

            db.Add(date, event);
        } else if (command == "Print") {
            db.Print(cout);
        } else if (command == "Del") {
            auto condition = ParseCondition(is);

            auto predicate = [condition](const Date& date, const string& event) {
                return condition->Evaluate(date, event);
            };

            int count = db.RemoveIf(predicate);

            cout << "Removed " << count << " entries" << endl;
        } else if (command == "Find") {
            auto condition = ParseCondition(is);

            auto predicate = [condition](const Date& date, const string& event) {
                return condition->Evaluate(date, event);
            };

            const auto entries = db.FindIf(predicate);

            for (const auto& entry : entries) {
                cout << entry << endl;
            }
            
            cout << "Found " << entries.size() << " entries" << endl;
        } else if (command == "Last") {
            try {
                cout << db.Last(ParseDate(is)) << endl;
            } catch (invalid_argument&) {
                cout << "No entries" << endl;
            }
        } else if (command.empty()) {
            continue;
        } else {
            throw logic_error("Unknown command: " + command);
        }
    }

    return 0;
}